

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O0

void D_DoServerInfoChange(BYTE **stream,bool singlebit)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  int type;
  int len;
  char name [64];
  char *value;
  bool singlebit_local;
  BYTE **stream_local;
  
  uVar1 = ReadByte(stream);
  uVar2 = uVar1 & 0x3f;
  if (uVar2 != 0) {
    memcpy(&type,*stream,(long)(int)uVar2);
    *stream = *stream + (int)uVar2;
    *(undefined1 *)((long)&type + (long)(int)uVar2) = 0;
    pcVar3 = SetServerVar((char *)&type,(int)uVar1 >> 6,stream,singlebit);
    if ((pcVar3 != (char *)0x0) && ((netgame & 1U) != 0)) {
      Printf("%s changed to %s\n",&type,pcVar3);
    }
  }
  return;
}

Assistant:

void D_DoServerInfoChange (BYTE **stream, bool singlebit)
{
	const char *value;
	char name[64];
	int len;
	int type;

	len = ReadByte (stream);
	type = len >> 6;
	len &= 0x3f;
	if (len == 0)
		return;
	memcpy (name, *stream, len);
	*stream += len;
	name[len] = 0;

	if ( (value = SetServerVar (name, (ECVarType)type, stream, singlebit)) && netgame)
	{
		Printf ("%s changed to %s\n", name, value);
	}
}